

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwsac.c
# Opt level: O2

uint8_t * lwsac_scan_extant(lwsac *head,uint8_t *find,size_t len,int nul)

{
  size_t sVar1;
  int iVar2;
  lwsac *__s1;
  
  do {
    if (head == (lwsac *)0x0) {
      return (uint8_t *)0x0;
    }
    sVar1 = head->ofs;
    if (len <= sVar1 - 0x20) {
      for (__s1 = head + 1; __s1 < (lwsac *)((long)head + (sVar1 - len));
          __s1 = (lwsac *)((long)&__s1->next + 1)) {
        if (((*(uint8_t *)&__s1->next == *find) &&
            (((nul == 0 || (*(uint8_t *)((long)&__s1->next + len) == '\0')) &&
             (*(uint8_t *)((long)__s1 + (len - 1)) == find[len - 1])))) &&
           (iVar2 = bcmp(__s1,find,len), iVar2 == 0)) {
          return (uint8_t *)__s1;
        }
      }
    }
    head = head->next;
  } while( true );
}

Assistant:

uint8_t *
lwsac_scan_extant(struct lwsac *head, uint8_t *find, size_t len, int nul)
{
	while (head) {
		uint8_t *pos = (uint8_t *)&head[1],
			*end = ((uint8_t *)head) + head->ofs - len;

		if (head->ofs - sizeof(*head) >= len)
			while (pos < end) {
				if (*pos == *find && (!nul || !pos[len]) &&
				    pos[len - 1] == find[len - 1] &&
				    !memcmp(pos, find, len))
					/* found the blob */
					return pos;
				pos++;
			}

		head = head->next;
	}

	return NULL;
}